

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void copyPrintSslCertificate(X509 *cert0)

{
  X509Cert copyCert;
  X509Cert cert;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  String string;
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> local_58;
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> local_50;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_48;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_28;
  
  local_58.m_h = (X509 *)0x0;
  local_48.m_count = 0;
  local_48.m_p = (char *)0x0;
  local_48.m_hdr = (Hdr *)0x0;
  local_50.m_h = cert0;
  axl::cry::X509Cert::saveDer
            ((X509Cert *)&local_50,(Array<char,_axl::sl::ArrayDetails<char>_> *)&local_48);
  axl::cry::X509Cert::loadDer((X509Cert *)&local_58,local_48.m_p,local_48.m_count);
  puts("DER-copy:");
  printSslCertificate(local_58.m_h);
  local_28.m_length._0_1_ = 0;
  local_28.m_length._1_7_ = 0;
  local_28.m_isNullTerminated = false;
  local_28.m_p = (C *)0x0;
  local_28.m_hdr._0_1_ = 0;
  local_28.m_hdr._1_7_ = 0;
  axl::cry::X509Cert::savePem((X509Cert *)&local_50,(String *)&local_28);
  axl::cry::X509Cert::loadPem
            ((X509Cert *)&local_58,local_28.m_p,
             CONCAT71(local_28.m_length._1_7_,(undefined1)local_28.m_length));
  puts("PEM-copy:");
  printSslCertificate(local_58.m_h);
  local_50.m_h = (x509_st *)0x0;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_28);
  axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_48);
  axl::sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::~Handle(&local_58);
  axl::sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::~Handle(&local_50);
  return;
}

Assistant:

void
copyPrintSslCertificate(X509* cert0) {
	cry::X509Cert cert = cert0;
	cry::X509Cert copyCert;

	sl::Array<char> buffer = cert.saveDer();
	copyCert.loadDer(buffer, buffer.getCount());
	printf("DER-copy:\n");
	printSslCertificate(copyCert);

	sl::String string = cert.savePem();
	copyCert.loadPem(string);
	printf("PEM-copy:\n");
	printSslCertificate(copyCert);

	cert.detach();
}